

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O1

int cvHin(CVodeMem cv_mem,realtype tout)

{
  N_Vector x;
  N_Vector z;
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dd_00;
  realtype rVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 local_a8 [16];
  undefined8 uStack_50;
  undefined8 local_40;
  
  dVar3 = tout - cv_mem->cv_tn;
  iVar7 = -0x1b;
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    return -0x1b;
  }
  dVar4 = ABS(cv_mem->cv_tn);
  if (dVar4 <= ABS(tout)) {
    dVar4 = ABS(tout);
  }
  dVar4 = dVar4 * cv_mem->cv_uround;
  if (dVar4 + dVar4 <= ABS(dVar3)) {
    dVar4 = dVar4 * 100.0;
    x = cv_mem->cv_tempv;
    z = cv_mem->cv_acor;
    N_VAbs(cv_mem->cv_zn[0],z);
    (*cv_mem->cv_efun)(cv_mem->cv_zn[0],x,cv_mem->cv_e_data);
    N_VInv(x,x);
    N_VLinearSum(0.1,z,1.0,x,x);
    N_VAbs(cv_mem->cv_zn[1],z);
    N_VDiv(z,x,x);
    rVar13 = N_VMaxNorm(x);
    dVar16 = ABS(dVar3) * 0.1;
    uVar8 = -(ulong)(1.0 < dVar16 * rVar13);
    dVar15 = (double)(~uVar8 & (ulong)dVar16 | (ulong)(1.0 / rVar13) & uVar8);
    dVar16 = dVar15 * dVar4;
    local_a8 = ZEXT816(0);
    if (0.0 < dVar16) {
      if (dVar16 < 0.0) {
        dVar16 = sqrt(dVar16);
        local_a8._12_4_ = extraout_XMM0_Dd;
        local_a8._8_4_ = extraout_XMM0_Dc;
        local_a8._0_8_ = dVar16;
      }
      else {
        local_a8._0_8_ = SQRT(dVar16);
        local_a8._8_8_ = 0;
      }
    }
    dVar16 = local_a8._0_8_;
    if (dVar4 <= dVar15) {
      uVar6 = 1;
      uVar11 = local_a8._8_4_;
      uVar12 = local_a8._12_4_;
      while( true ) {
        iVar7 = 4;
        while( true ) {
          auVar2._8_4_ = uVar11;
          auVar2._0_8_ = dVar16;
          auVar2._12_4_ = uVar12;
          rVar13 = (realtype)
                   (~-(ulong)(dVar3 <= 0.0) & (ulong)dVar16 |
                   (ulong)-dVar16 & -(ulong)(dVar3 <= 0.0));
          N_VLinearSum(rVar13,cv_mem->cv_zn[1],1.0,cv_mem->cv_zn[0],cv_mem->cv_y);
          iVar5 = (*cv_mem->cv_f)(cv_mem->cv_tn + rVar13,cv_mem->cv_y,cv_mem->cv_tempv,
                                  cv_mem->cv_user_data);
          cv_mem->cv_nfe = cv_mem->cv_nfe + 1;
          uVar9 = (undefined4)local_40;
          uVar10 = (undefined4)((ulong)local_40 >> 0x20);
          if (iVar5 == 0) {
            N_VLinearSum(1.0 / rVar13,cv_mem->cv_tempv,-1.0 / rVar13,cv_mem->cv_zn[1],
                         cv_mem->cv_tempv);
            rVar13 = N_VWrmsNorm(cv_mem->cv_tempv,cv_mem->cv_ewt);
            uVar9 = SUB84(rVar13,0);
            uVar10 = (undefined4)((ulong)rVar13 >> 0x20);
          }
          if (iVar5 < 0) {
            return -8;
          }
          local_40 = CONCAT44(uVar10,uVar9);
          if (iVar5 == 0) break;
          dVar16 = dVar16 * 0.2;
          iVar7 = iVar7 + -1;
          if (iVar7 == 0) {
            if (uVar6 < 3) {
              return -10;
            }
            goto LAB_004309cd;
          }
        }
        uStack_50 = auVar2._8_8_;
        if (dVar15 * (double)CONCAT44(uVar10,uVar9) * dVar15 <= 2.0) {
          dVar14 = dVar15 * dVar16;
        }
        else {
          dVar14 = 2.0 / (double)CONCAT44(uVar10,uVar9);
        }
        dVar1 = 0.0;
        uVar11 = 0;
        uVar12 = 0;
        if (0.0 < dVar14) {
          if (dVar14 < 0.0) {
            dVar1 = sqrt(dVar14);
            uVar11 = extraout_XMM0_Dc_00;
            uVar12 = extraout_XMM0_Dd_00;
          }
          else {
            uVar11 = 0;
            uVar12 = 0;
            dVar1 = SQRT(dVar14);
          }
        }
        local_a8._0_8_ = dVar1;
        if (((uVar6 == 4) || ((dVar14 = dVar1 / dVar16, 0.5 < dVar14 && (dVar14 < 2.0)))) ||
           ((1 < uVar6 && (local_a8._0_8_ = dVar16, 2.0 < dVar14)))) break;
        uVar6 = uVar6 + 1;
        local_a8._8_8_ = uStack_50;
        local_a8._0_8_ = dVar16;
        dVar16 = dVar1;
      }
LAB_004309cd:
      if (dVar4 <= (double)local_a8._0_8_ * 0.5) {
        dVar4 = (double)local_a8._0_8_ * 0.5;
      }
      if (dVar4 <= dVar15) {
        dVar15 = dVar4;
      }
      dVar16 = (double)(-(ulong)(dVar3 <= 0.0) & (ulong)-dVar15 |
                       ~-(ulong)(dVar3 <= 0.0) & (ulong)dVar15);
    }
    else if (dVar3 <= 0.0) {
      dVar16 = -dVar16;
    }
    cv_mem->cv_h = dVar16;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int cvHin(CVodeMem cv_mem, realtype tout)
{
  int retval, sign, count1, count2;
  realtype tdiff, tdist, tround, hlb, hub;
  realtype hg, hgs, hs, hnew, hrat, h0, yddnrm;
  booleantype hgOK;

  /* If tout is too close to tn, give up */

  if ((tdiff = tout-cv_mem->cv_tn) == ZERO) return(CV_TOO_CLOSE);

  sign = (tdiff > ZERO) ? 1 : -1;
  tdist = SUNRabs(tdiff);
  tround = cv_mem->cv_uround * SUNMAX(SUNRabs(cv_mem->cv_tn), SUNRabs(tout));

  if (tdist < TWO*tround) return(CV_TOO_CLOSE);

  /*
     Set lower and upper bounds on h0, and take geometric mean
     as first trial value.
     Exit with this value if the bounds cross each other.
  */

  hlb = HLB_FACTOR * tround;
  hub = cvUpperBoundH0(cv_mem, tdist);

  hg  = SUNRsqrt(hlb*hub);

  if (hub < hlb) {
    if (sign == -1) cv_mem->cv_h = -hg;
    else            cv_mem->cv_h =  hg;
    return(CV_SUCCESS);
  }

  /* Outer loop */

  hs = hg;         /* safeguard against 'uninitialized variable' warning */

  for(count1 = 1; count1 <= MAX_ITERS; count1++) {

    /* Attempts to estimate ydd */

    hgOK = SUNFALSE;

    for (count2 = 1; count2 <= MAX_ITERS; count2++) {
      hgs = hg*sign;
      retval = cvYddNorm(cv_mem, hgs, &yddnrm);
      /* If the RHS function failed unrecoverably, give up */
      if (retval < 0) return(CV_RHSFUNC_FAIL);
      /* If successful, we can use ydd */
      if (retval == CV_SUCCESS) {hgOK = SUNTRUE; break;}
      /* The RHS function failed recoverably; cut step size and test again */
      hg *= POINT2;
    }

    /* If the RHS function failed recoverably MAX_ITERS times */

    if (!hgOK) {
      /* Exit if this is the first or second pass. No recovery possible */
      if (count1 <= 2) return(CV_REPTD_RHSFUNC_ERR);
      /* We have a fall-back option. The value hs is a previous hnew which
         passed through f(). Use it and break */
      hnew = hs;
      break;
    }

    /* The proposed step size is feasible. Save it. */
    hs = hg;

    /* Propose new step size */
    hnew = (yddnrm*hub*hub > TWO) ? SUNRsqrt(TWO/yddnrm) : SUNRsqrt(hg*hub);

    /* If last pass, stop now with hnew */
    if (count1 == MAX_ITERS) break;

    hrat = hnew/hg;

    /* Accept hnew if it does not differ from hg by more than a factor of 2 */
    if ((hrat > HALF) && (hrat < TWO)) break;

    /* After one pass, if ydd seems to be bad, use fall-back value. */
    if ((count1 > 1) && (hrat > TWO)) {
      hnew = hg;
      break;
    }

    /* Send this value back through f() */
    hg = hnew;

  }

  /* Apply bounds, bias factor, and attach sign */

  h0 = H_BIAS*hnew;
  if (h0 < hlb) h0 = hlb;
  if (h0 > hub) h0 = hub;
  if (sign == -1) h0 = -h0;
  cv_mem->cv_h = h0;

  return(CV_SUCCESS);
}